

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O0

int pospopcnt_u16_avx2_blend_popcnt_unroll16(uint16_t *array,uint32_t len,uint32_t *flags)

{
  undefined1 (*pauVar1) [32];
  undefined1 (*pauVar2) [32];
  undefined1 (*pauVar3) [32];
  undefined1 (*pauVar4) [32];
  undefined1 (*pauVar5) [32];
  undefined1 (*pauVar6) [32];
  undefined1 (*pauVar7) [32];
  undefined1 (*pauVar8) [32];
  undefined1 (*pauVar9) [32];
  undefined1 (*pauVar10) [32];
  undefined1 (*pauVar11) [32];
  undefined1 (*pauVar12) [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  uint uVar45;
  undefined1 (*pauVar46) [32];
  undefined1 (*pauVar47) [32];
  undefined1 (*pauVar48) [32];
  undefined1 (*pauVar49) [32];
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  undefined1 auVar50 [16];
  int j;
  int i_4;
  __m256i input1_3;
  __m256i input0_3;
  __m256i v1_3;
  __m256i v0_3;
  int i_3;
  __m256i input3_2;
  __m256i input2_2;
  __m256i input1_2;
  __m256i input0_2;
  __m256i v3_2;
  __m256i v2_2;
  __m256i v1_2;
  __m256i v0_2;
  int i_2;
  __m256i input7_1;
  __m256i input6_1;
  __m256i input5_1;
  __m256i input4_1;
  __m256i input3_1;
  __m256i input2_1;
  __m256i input1_1;
  __m256i input0_1;
  __m256i v7_1;
  __m256i v6_1;
  __m256i v5_1;
  __m256i v4_1;
  __m256i v3_1;
  __m256i v2_1;
  __m256i v1_1;
  __m256i v0_1;
  int i_1;
  __m256i input15;
  __m256i input14;
  __m256i input13;
  __m256i input12;
  __m256i input11;
  __m256i input10;
  __m256i input9;
  __m256i input8;
  __m256i input7;
  __m256i input6;
  __m256i input5;
  __m256i input4;
  __m256i input3;
  __m256i input2;
  __m256i input1;
  __m256i input0;
  __m256i v15;
  __m256i v14;
  __m256i v13;
  __m256i v12;
  __m256i v11;
  __m256i v10;
  __m256i v9;
  __m256i v8;
  __m256i v7;
  __m256i v6;
  __m256i v5;
  __m256i v4;
  __m256i v3;
  __m256i v2;
  __m256i v1;
  __m256i v0;
  size_t i;
  uint32_t n_cycles;
  __m256i *data_vectors;
  undefined4 local_3368;
  undefined4 local_3364;
  undefined1 local_3360 [32];
  undefined1 local_3340 [32];
  undefined4 local_32c4;
  undefined1 local_32c0 [32];
  undefined1 local_32a0 [32];
  undefined1 local_3280 [32];
  undefined1 local_3260 [32];
  undefined4 local_31a4;
  undefined1 local_31a0 [32];
  undefined1 local_3180 [32];
  undefined1 local_3160 [32];
  undefined1 local_3140 [32];
  undefined1 local_3120 [32];
  undefined1 local_3100 [32];
  undefined1 local_30e0 [32];
  undefined1 local_30c0 [32];
  undefined4 local_2f84;
  undefined1 local_2f80 [32];
  undefined1 local_2f60 [32];
  undefined1 local_2f40 [32];
  undefined1 local_2f20 [32];
  undefined1 local_2f00 [32];
  undefined1 local_2ee0 [32];
  undefined1 local_2ec0 [32];
  undefined1 local_2ea0 [32];
  undefined1 local_2e80 [32];
  undefined1 local_2e60 [32];
  undefined1 local_2e40 [32];
  undefined1 local_2e20 [32];
  undefined1 local_2e00 [32];
  undefined1 local_2de0 [32];
  undefined1 local_2dc0 [32];
  undefined1 local_2da0 [32];
  undefined8 local_2b70;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  
  uVar45 = in_ESI >> 4;
  for (local_2b70 = 0; local_2b70 + 0x10 <= (ulong)uVar45; local_2b70 = local_2b70 + 0x10) {
    pauVar46 = (undefined1 (*) [32])(in_RDI + local_2b70 * 0x20);
    pauVar1 = (undefined1 (*) [32])(in_RDI + 0x20 + local_2b70 * 0x20);
    pauVar49 = (undefined1 (*) [32])(in_RDI + 0x40 + local_2b70 * 0x20);
    pauVar2 = (undefined1 (*) [32])(in_RDI + 0x60 + local_2b70 * 0x20);
    pauVar48 = (undefined1 (*) [32])(in_RDI + 0x80 + local_2b70 * 0x20);
    pauVar3 = (undefined1 (*) [32])(in_RDI + 0xa0 + local_2b70 * 0x20);
    pauVar4 = (undefined1 (*) [32])(in_RDI + 0xc0 + local_2b70 * 0x20);
    pauVar5 = (undefined1 (*) [32])(in_RDI + 0xe0 + local_2b70 * 0x20);
    pauVar47 = (undefined1 (*) [32])(in_RDI + 0x100 + local_2b70 * 0x20);
    pauVar6 = (undefined1 (*) [32])(in_RDI + 0x120 + local_2b70 * 0x20);
    pauVar7 = (undefined1 (*) [32])(in_RDI + 0x140 + local_2b70 * 0x20);
    pauVar8 = (undefined1 (*) [32])(in_RDI + 0x160 + local_2b70 * 0x20);
    pauVar9 = (undefined1 (*) [32])(in_RDI + 0x180 + local_2b70 * 0x20);
    pauVar10 = (undefined1 (*) [32])(in_RDI + 0x1a0 + local_2b70 * 0x20);
    pauVar11 = (undefined1 (*) [32])(in_RDI + 0x1c0 + local_2b70 * 0x20);
    pauVar12 = (undefined1 (*) [32])(in_RDI + 0x1e0 + local_2b70 * 0x20);
    auVar13 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar13 = vpinsrw_avx(auVar13,0xff,2);
    auVar13 = vpinsrw_avx(auVar13,0xff,3);
    auVar13 = vpinsrw_avx(auVar13,0xff,4);
    auVar13 = vpinsrw_avx(auVar13,0xff,5);
    auVar13 = vpinsrw_avx(auVar13,0xff,6);
    auVar13 = vpinsrw_avx(auVar13,0xff,7);
    auVar14 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar14 = vpinsrw_avx(auVar14,0xff,2);
    auVar14 = vpinsrw_avx(auVar14,0xff,3);
    auVar14 = vpinsrw_avx(auVar14,0xff,4);
    auVar14 = vpinsrw_avx(auVar14,0xff,5);
    auVar14 = vpinsrw_avx(auVar14,0xff,6);
    auVar14 = vpinsrw_avx(auVar14,0xff,7);
    uStack_1370 = auVar14._0_8_;
    uStack_1368 = auVar14._8_8_;
    auVar44._16_8_ = uStack_1370;
    auVar44._0_16_ = auVar13;
    auVar44._24_8_ = uStack_1368;
    auVar15 = vpand_avx2(*pauVar46,auVar44);
    auVar16 = vpsllw_avx2(*pauVar1,ZEXT416(8));
    local_2da0 = vpor_avx2(auVar15,auVar16);
    auVar13 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar13 = vpinsrw_avx(auVar13,0xff00,2);
    auVar13 = vpinsrw_avx(auVar13,0xff00,3);
    auVar13 = vpinsrw_avx(auVar13,0xff00,4);
    auVar13 = vpinsrw_avx(auVar13,0xff00,5);
    auVar13 = vpinsrw_avx(auVar13,0xff00,6);
    auVar13 = vpinsrw_avx(auVar13,0xff00,7);
    auVar14 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar14 = vpinsrw_avx(auVar14,0xff00,2);
    auVar14 = vpinsrw_avx(auVar14,0xff00,3);
    auVar14 = vpinsrw_avx(auVar14,0xff00,4);
    auVar14 = vpinsrw_avx(auVar14,0xff00,5);
    auVar14 = vpinsrw_avx(auVar14,0xff00,6);
    auVar14 = vpinsrw_avx(auVar14,0xff00,7);
    uStack_1330 = auVar14._0_8_;
    uStack_1328 = auVar14._8_8_;
    auVar43._16_8_ = uStack_1330;
    auVar43._0_16_ = auVar13;
    auVar43._24_8_ = uStack_1328;
    auVar15 = vpand_avx2(*pauVar46,auVar43);
    auVar16 = vpsrlw_avx2(*pauVar1,ZEXT416(8));
    local_2dc0 = vpor_avx2(auVar15,auVar16);
    auVar13 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar13 = vpinsrw_avx(auVar13,0xff,2);
    auVar13 = vpinsrw_avx(auVar13,0xff,3);
    auVar13 = vpinsrw_avx(auVar13,0xff,4);
    auVar13 = vpinsrw_avx(auVar13,0xff,5);
    auVar13 = vpinsrw_avx(auVar13,0xff,6);
    auVar13 = vpinsrw_avx(auVar13,0xff,7);
    auVar14 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar14 = vpinsrw_avx(auVar14,0xff,2);
    auVar14 = vpinsrw_avx(auVar14,0xff,3);
    auVar14 = vpinsrw_avx(auVar14,0xff,4);
    auVar14 = vpinsrw_avx(auVar14,0xff,5);
    auVar14 = vpinsrw_avx(auVar14,0xff,6);
    auVar14 = vpinsrw_avx(auVar14,0xff,7);
    uStack_12f0 = auVar14._0_8_;
    uStack_12e8 = auVar14._8_8_;
    auVar42._16_8_ = uStack_12f0;
    auVar42._0_16_ = auVar13;
    auVar42._24_8_ = uStack_12e8;
    auVar15 = vpand_avx2(*pauVar49,auVar42);
    auVar16 = vpsllw_avx2(*pauVar2,ZEXT416(8));
    local_2de0 = vpor_avx2(auVar15,auVar16);
    auVar13 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar13 = vpinsrw_avx(auVar13,0xff00,2);
    auVar13 = vpinsrw_avx(auVar13,0xff00,3);
    auVar13 = vpinsrw_avx(auVar13,0xff00,4);
    auVar13 = vpinsrw_avx(auVar13,0xff00,5);
    auVar13 = vpinsrw_avx(auVar13,0xff00,6);
    auVar13 = vpinsrw_avx(auVar13,0xff00,7);
    auVar14 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar14 = vpinsrw_avx(auVar14,0xff00,2);
    auVar14 = vpinsrw_avx(auVar14,0xff00,3);
    auVar14 = vpinsrw_avx(auVar14,0xff00,4);
    auVar14 = vpinsrw_avx(auVar14,0xff00,5);
    auVar14 = vpinsrw_avx(auVar14,0xff00,6);
    auVar14 = vpinsrw_avx(auVar14,0xff00,7);
    uStack_12b0 = auVar14._0_8_;
    uStack_12a8 = auVar14._8_8_;
    auVar41._16_8_ = uStack_12b0;
    auVar41._0_16_ = auVar13;
    auVar41._24_8_ = uStack_12a8;
    auVar15 = vpand_avx2(*pauVar49,auVar41);
    auVar16 = vpsrlw_avx2(*pauVar2,ZEXT416(8));
    local_2e00 = vpor_avx2(auVar15,auVar16);
    auVar13 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar13 = vpinsrw_avx(auVar13,0xff,2);
    auVar13 = vpinsrw_avx(auVar13,0xff,3);
    auVar13 = vpinsrw_avx(auVar13,0xff,4);
    auVar13 = vpinsrw_avx(auVar13,0xff,5);
    auVar13 = vpinsrw_avx(auVar13,0xff,6);
    auVar13 = vpinsrw_avx(auVar13,0xff,7);
    auVar14 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar14 = vpinsrw_avx(auVar14,0xff,2);
    auVar14 = vpinsrw_avx(auVar14,0xff,3);
    auVar14 = vpinsrw_avx(auVar14,0xff,4);
    auVar14 = vpinsrw_avx(auVar14,0xff,5);
    auVar14 = vpinsrw_avx(auVar14,0xff,6);
    auVar14 = vpinsrw_avx(auVar14,0xff,7);
    uStack_1270 = auVar14._0_8_;
    uStack_1268 = auVar14._8_8_;
    auVar40._16_8_ = uStack_1270;
    auVar40._0_16_ = auVar13;
    auVar40._24_8_ = uStack_1268;
    auVar15 = vpand_avx2(*pauVar48,auVar40);
    auVar16 = vpsllw_avx2(*pauVar3,ZEXT416(8));
    local_2e20 = vpor_avx2(auVar15,auVar16);
    auVar13 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar13 = vpinsrw_avx(auVar13,0xff00,2);
    auVar13 = vpinsrw_avx(auVar13,0xff00,3);
    auVar13 = vpinsrw_avx(auVar13,0xff00,4);
    auVar13 = vpinsrw_avx(auVar13,0xff00,5);
    auVar13 = vpinsrw_avx(auVar13,0xff00,6);
    auVar13 = vpinsrw_avx(auVar13,0xff00,7);
    auVar14 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar14 = vpinsrw_avx(auVar14,0xff00,2);
    auVar14 = vpinsrw_avx(auVar14,0xff00,3);
    auVar14 = vpinsrw_avx(auVar14,0xff00,4);
    auVar14 = vpinsrw_avx(auVar14,0xff00,5);
    auVar14 = vpinsrw_avx(auVar14,0xff00,6);
    auVar14 = vpinsrw_avx(auVar14,0xff00,7);
    uStack_1230 = auVar14._0_8_;
    uStack_1228 = auVar14._8_8_;
    auVar39._16_8_ = uStack_1230;
    auVar39._0_16_ = auVar13;
    auVar39._24_8_ = uStack_1228;
    auVar15 = vpand_avx2(*pauVar48,auVar39);
    auVar16 = vpsrlw_avx2(*pauVar3,ZEXT416(8));
    local_2e40 = vpor_avx2(auVar15,auVar16);
    auVar13 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar13 = vpinsrw_avx(auVar13,0xff,2);
    auVar13 = vpinsrw_avx(auVar13,0xff,3);
    auVar13 = vpinsrw_avx(auVar13,0xff,4);
    auVar13 = vpinsrw_avx(auVar13,0xff,5);
    auVar13 = vpinsrw_avx(auVar13,0xff,6);
    auVar13 = vpinsrw_avx(auVar13,0xff,7);
    auVar14 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar14 = vpinsrw_avx(auVar14,0xff,2);
    auVar14 = vpinsrw_avx(auVar14,0xff,3);
    auVar14 = vpinsrw_avx(auVar14,0xff,4);
    auVar14 = vpinsrw_avx(auVar14,0xff,5);
    auVar14 = vpinsrw_avx(auVar14,0xff,6);
    auVar14 = vpinsrw_avx(auVar14,0xff,7);
    uStack_11f0 = auVar14._0_8_;
    uStack_11e8 = auVar14._8_8_;
    auVar38._16_8_ = uStack_11f0;
    auVar38._0_16_ = auVar13;
    auVar38._24_8_ = uStack_11e8;
    auVar15 = vpand_avx2(*pauVar4,auVar38);
    auVar16 = vpsllw_avx2(*pauVar5,ZEXT416(8));
    local_2e60 = vpor_avx2(auVar15,auVar16);
    auVar13 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar13 = vpinsrw_avx(auVar13,0xff00,2);
    auVar13 = vpinsrw_avx(auVar13,0xff00,3);
    auVar13 = vpinsrw_avx(auVar13,0xff00,4);
    auVar13 = vpinsrw_avx(auVar13,0xff00,5);
    auVar13 = vpinsrw_avx(auVar13,0xff00,6);
    auVar13 = vpinsrw_avx(auVar13,0xff00,7);
    auVar14 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar14 = vpinsrw_avx(auVar14,0xff00,2);
    auVar14 = vpinsrw_avx(auVar14,0xff00,3);
    auVar14 = vpinsrw_avx(auVar14,0xff00,4);
    auVar14 = vpinsrw_avx(auVar14,0xff00,5);
    auVar14 = vpinsrw_avx(auVar14,0xff00,6);
    auVar14 = vpinsrw_avx(auVar14,0xff00,7);
    uStack_11b0 = auVar14._0_8_;
    uStack_11a8 = auVar14._8_8_;
    auVar37._16_8_ = uStack_11b0;
    auVar37._0_16_ = auVar13;
    auVar37._24_8_ = uStack_11a8;
    auVar15 = vpand_avx2(*pauVar4,auVar37);
    auVar16 = vpsrlw_avx2(*pauVar5,ZEXT416(8));
    local_2e80 = vpor_avx2(auVar15,auVar16);
    auVar13 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar13 = vpinsrw_avx(auVar13,0xff,2);
    auVar13 = vpinsrw_avx(auVar13,0xff,3);
    auVar13 = vpinsrw_avx(auVar13,0xff,4);
    auVar13 = vpinsrw_avx(auVar13,0xff,5);
    auVar13 = vpinsrw_avx(auVar13,0xff,6);
    auVar13 = vpinsrw_avx(auVar13,0xff,7);
    auVar14 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar14 = vpinsrw_avx(auVar14,0xff,2);
    auVar14 = vpinsrw_avx(auVar14,0xff,3);
    auVar14 = vpinsrw_avx(auVar14,0xff,4);
    auVar14 = vpinsrw_avx(auVar14,0xff,5);
    auVar14 = vpinsrw_avx(auVar14,0xff,6);
    auVar14 = vpinsrw_avx(auVar14,0xff,7);
    uStack_1170 = auVar14._0_8_;
    uStack_1168 = auVar14._8_8_;
    auVar36._16_8_ = uStack_1170;
    auVar36._0_16_ = auVar13;
    auVar36._24_8_ = uStack_1168;
    auVar15 = vpand_avx2(*pauVar47,auVar36);
    auVar16 = vpsllw_avx2(*pauVar6,ZEXT416(8));
    local_2ea0 = vpor_avx2(auVar15,auVar16);
    auVar13 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar13 = vpinsrw_avx(auVar13,0xff00,2);
    auVar13 = vpinsrw_avx(auVar13,0xff00,3);
    auVar13 = vpinsrw_avx(auVar13,0xff00,4);
    auVar13 = vpinsrw_avx(auVar13,0xff00,5);
    auVar13 = vpinsrw_avx(auVar13,0xff00,6);
    auVar13 = vpinsrw_avx(auVar13,0xff00,7);
    auVar14 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar14 = vpinsrw_avx(auVar14,0xff00,2);
    auVar14 = vpinsrw_avx(auVar14,0xff00,3);
    auVar14 = vpinsrw_avx(auVar14,0xff00,4);
    auVar14 = vpinsrw_avx(auVar14,0xff00,5);
    auVar14 = vpinsrw_avx(auVar14,0xff00,6);
    auVar14 = vpinsrw_avx(auVar14,0xff00,7);
    uStack_1130 = auVar14._0_8_;
    uStack_1128 = auVar14._8_8_;
    auVar35._16_8_ = uStack_1130;
    auVar35._0_16_ = auVar13;
    auVar35._24_8_ = uStack_1128;
    auVar15 = vpand_avx2(*pauVar47,auVar35);
    auVar16 = vpsrlw_avx2(*pauVar6,ZEXT416(8));
    local_2ec0 = vpor_avx2(auVar15,auVar16);
    auVar13 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar13 = vpinsrw_avx(auVar13,0xff,2);
    auVar13 = vpinsrw_avx(auVar13,0xff,3);
    auVar13 = vpinsrw_avx(auVar13,0xff,4);
    auVar13 = vpinsrw_avx(auVar13,0xff,5);
    auVar13 = vpinsrw_avx(auVar13,0xff,6);
    auVar13 = vpinsrw_avx(auVar13,0xff,7);
    auVar14 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar14 = vpinsrw_avx(auVar14,0xff,2);
    auVar14 = vpinsrw_avx(auVar14,0xff,3);
    auVar14 = vpinsrw_avx(auVar14,0xff,4);
    auVar14 = vpinsrw_avx(auVar14,0xff,5);
    auVar14 = vpinsrw_avx(auVar14,0xff,6);
    auVar14 = vpinsrw_avx(auVar14,0xff,7);
    uStack_10f0 = auVar14._0_8_;
    uStack_10e8 = auVar14._8_8_;
    auVar34._16_8_ = uStack_10f0;
    auVar34._0_16_ = auVar13;
    auVar34._24_8_ = uStack_10e8;
    auVar15 = vpand_avx2(*pauVar7,auVar34);
    auVar16 = vpsllw_avx2(*pauVar8,ZEXT416(8));
    local_2ee0 = vpor_avx2(auVar15,auVar16);
    auVar13 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar13 = vpinsrw_avx(auVar13,0xff00,2);
    auVar13 = vpinsrw_avx(auVar13,0xff00,3);
    auVar13 = vpinsrw_avx(auVar13,0xff00,4);
    auVar13 = vpinsrw_avx(auVar13,0xff00,5);
    auVar13 = vpinsrw_avx(auVar13,0xff00,6);
    auVar13 = vpinsrw_avx(auVar13,0xff00,7);
    auVar14 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar14 = vpinsrw_avx(auVar14,0xff00,2);
    auVar14 = vpinsrw_avx(auVar14,0xff00,3);
    auVar14 = vpinsrw_avx(auVar14,0xff00,4);
    auVar14 = vpinsrw_avx(auVar14,0xff00,5);
    auVar14 = vpinsrw_avx(auVar14,0xff00,6);
    auVar14 = vpinsrw_avx(auVar14,0xff00,7);
    uStack_10b0 = auVar14._0_8_;
    uStack_10a8 = auVar14._8_8_;
    auVar33._16_8_ = uStack_10b0;
    auVar33._0_16_ = auVar13;
    auVar33._24_8_ = uStack_10a8;
    auVar15 = vpand_avx2(*pauVar7,auVar33);
    auVar16 = vpsrlw_avx2(*pauVar8,ZEXT416(8));
    local_2f00 = vpor_avx2(auVar15,auVar16);
    auVar13 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar13 = vpinsrw_avx(auVar13,0xff,2);
    auVar13 = vpinsrw_avx(auVar13,0xff,3);
    auVar13 = vpinsrw_avx(auVar13,0xff,4);
    auVar13 = vpinsrw_avx(auVar13,0xff,5);
    auVar13 = vpinsrw_avx(auVar13,0xff,6);
    auVar13 = vpinsrw_avx(auVar13,0xff,7);
    auVar14 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar14 = vpinsrw_avx(auVar14,0xff,2);
    auVar14 = vpinsrw_avx(auVar14,0xff,3);
    auVar14 = vpinsrw_avx(auVar14,0xff,4);
    auVar14 = vpinsrw_avx(auVar14,0xff,5);
    auVar14 = vpinsrw_avx(auVar14,0xff,6);
    auVar14 = vpinsrw_avx(auVar14,0xff,7);
    uStack_1070 = auVar14._0_8_;
    uStack_1068 = auVar14._8_8_;
    auVar32._16_8_ = uStack_1070;
    auVar32._0_16_ = auVar13;
    auVar32._24_8_ = uStack_1068;
    auVar15 = vpand_avx2(*pauVar9,auVar32);
    auVar16 = vpsllw_avx2(*pauVar10,ZEXT416(8));
    local_2f20 = vpor_avx2(auVar15,auVar16);
    auVar13 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar13 = vpinsrw_avx(auVar13,0xff00,2);
    auVar13 = vpinsrw_avx(auVar13,0xff00,3);
    auVar13 = vpinsrw_avx(auVar13,0xff00,4);
    auVar13 = vpinsrw_avx(auVar13,0xff00,5);
    auVar13 = vpinsrw_avx(auVar13,0xff00,6);
    auVar13 = vpinsrw_avx(auVar13,0xff00,7);
    auVar14 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar14 = vpinsrw_avx(auVar14,0xff00,2);
    auVar14 = vpinsrw_avx(auVar14,0xff00,3);
    auVar14 = vpinsrw_avx(auVar14,0xff00,4);
    auVar14 = vpinsrw_avx(auVar14,0xff00,5);
    auVar14 = vpinsrw_avx(auVar14,0xff00,6);
    auVar14 = vpinsrw_avx(auVar14,0xff00,7);
    uStack_1030 = auVar14._0_8_;
    uStack_1028 = auVar14._8_8_;
    auVar31._16_8_ = uStack_1030;
    auVar31._0_16_ = auVar13;
    auVar31._24_8_ = uStack_1028;
    auVar15 = vpand_avx2(*pauVar9,auVar31);
    auVar16 = vpsrlw_avx2(*pauVar10,ZEXT416(8));
    local_2f40 = vpor_avx2(auVar15,auVar16);
    auVar13 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar13 = vpinsrw_avx(auVar13,0xff,2);
    auVar13 = vpinsrw_avx(auVar13,0xff,3);
    auVar13 = vpinsrw_avx(auVar13,0xff,4);
    auVar13 = vpinsrw_avx(auVar13,0xff,5);
    auVar13 = vpinsrw_avx(auVar13,0xff,6);
    auVar13 = vpinsrw_avx(auVar13,0xff,7);
    auVar14 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar14 = vpinsrw_avx(auVar14,0xff,2);
    auVar14 = vpinsrw_avx(auVar14,0xff,3);
    auVar14 = vpinsrw_avx(auVar14,0xff,4);
    auVar14 = vpinsrw_avx(auVar14,0xff,5);
    auVar14 = vpinsrw_avx(auVar14,0xff,6);
    auVar14 = vpinsrw_avx(auVar14,0xff,7);
    uStack_ff0 = auVar14._0_8_;
    uStack_fe8 = auVar14._8_8_;
    auVar16._16_8_ = uStack_ff0;
    auVar16._0_16_ = auVar13;
    auVar16._24_8_ = uStack_fe8;
    auVar15 = vpand_avx2(*pauVar11,auVar16);
    auVar16 = vpsllw_avx2(*pauVar12,ZEXT416(8));
    local_2f60 = vpor_avx2(auVar15,auVar16);
    auVar13 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar13 = vpinsrw_avx(auVar13,0xff00,2);
    auVar13 = vpinsrw_avx(auVar13,0xff00,3);
    auVar13 = vpinsrw_avx(auVar13,0xff00,4);
    auVar13 = vpinsrw_avx(auVar13,0xff00,5);
    auVar13 = vpinsrw_avx(auVar13,0xff00,6);
    auVar13 = vpinsrw_avx(auVar13,0xff00,7);
    auVar14 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar14 = vpinsrw_avx(auVar14,0xff00,2);
    auVar14 = vpinsrw_avx(auVar14,0xff00,3);
    auVar14 = vpinsrw_avx(auVar14,0xff00,4);
    auVar14 = vpinsrw_avx(auVar14,0xff00,5);
    auVar14 = vpinsrw_avx(auVar14,0xff00,6);
    auVar14 = vpinsrw_avx(auVar14,0xff00,7);
    auVar50 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar13;
    uStack_fb0 = auVar50._0_8_;
    uStack_fa8 = auVar50._8_8_;
    auVar15._16_8_ = uStack_fb0;
    auVar15._0_16_ = ZEXT116(0) * auVar13 + ZEXT116(1) * auVar14;
    auVar15._24_8_ = uStack_fa8;
    auVar15 = vpand_avx2(*pauVar11,auVar15);
    auVar16 = vpsrlw_avx2(*pauVar12,ZEXT416(8));
    local_2f80 = vpor_avx2(auVar15,auVar16);
    for (local_2f84 = 0; local_2f84 < 8; local_2f84 = local_2f84 + 1) {
      *(int *)(in_RDX + (long)(7 - local_2f84) * 4) =
           POPCOUNT((uint)(SUB321(local_2da0 >> 7,0) & 1) |
                    (uint)(SUB321(local_2da0 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_2da0 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_2da0 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_2da0 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_2da0 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_2da0 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_2da0 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_2da0 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_2da0 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_2da0 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_2da0 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_2da0 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_2da0 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_2da0 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_2da0 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_2da0 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_2da0 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_2da0 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_2da0 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_2da0 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_2da0 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_2da0 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_2da0 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_2da0 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_2da0 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_2da0 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_2da0 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_2da0 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_2da0 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_2da0 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_2da0[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(7 - local_2f84) * 4);
      *(int *)(in_RDX + (long)(0xf - local_2f84) * 4) =
           POPCOUNT((uint)(SUB321(local_2dc0 >> 7,0) & 1) |
                    (uint)(SUB321(local_2dc0 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_2dc0 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_2dc0 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_2dc0 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_2dc0 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_2dc0 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_2dc0 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_2dc0 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_2dc0 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_2dc0 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_2dc0 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_2dc0 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_2dc0 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_2dc0 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_2dc0 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_2dc0 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_2dc0 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_2dc0 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_2dc0 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_2dc0 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_2dc0 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_2dc0 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_2dc0 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_2dc0 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_2dc0 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_2dc0 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_2dc0 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_2dc0 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_2dc0 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_2dc0 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_2dc0[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(0xf - local_2f84) * 4);
      *(int *)(in_RDX + (long)(7 - local_2f84) * 4) =
           POPCOUNT((uint)(SUB321(local_2de0 >> 7,0) & 1) |
                    (uint)(SUB321(local_2de0 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_2de0 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_2de0 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_2de0 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_2de0 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_2de0 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_2de0 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_2de0 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_2de0 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_2de0 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_2de0 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_2de0 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_2de0 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_2de0 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_2de0 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_2de0 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_2de0 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_2de0 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_2de0 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_2de0 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_2de0 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_2de0 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_2de0 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_2de0 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_2de0 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_2de0 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_2de0 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_2de0 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_2de0 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_2de0 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_2de0[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(7 - local_2f84) * 4);
      *(int *)(in_RDX + (long)(0xf - local_2f84) * 4) =
           POPCOUNT((uint)(SUB321(local_2e00 >> 7,0) & 1) |
                    (uint)(SUB321(local_2e00 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_2e00 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_2e00 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_2e00 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_2e00 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_2e00 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_2e00 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_2e00 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_2e00 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_2e00 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_2e00 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_2e00 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_2e00 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_2e00 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_2e00 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_2e00 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_2e00 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_2e00 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_2e00 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_2e00 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_2e00 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_2e00 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_2e00 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_2e00 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_2e00 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_2e00 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_2e00 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_2e00 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_2e00 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_2e00 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_2e00[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(0xf - local_2f84) * 4);
      *(int *)(in_RDX + (long)(7 - local_2f84) * 4) =
           POPCOUNT((uint)(SUB321(local_2e20 >> 7,0) & 1) |
                    (uint)(SUB321(local_2e20 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_2e20 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_2e20 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_2e20 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_2e20 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_2e20 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_2e20 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_2e20 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_2e20 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_2e20 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_2e20 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_2e20 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_2e20 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_2e20 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_2e20 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_2e20 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_2e20 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_2e20 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_2e20 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_2e20 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_2e20 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_2e20 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_2e20 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_2e20 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_2e20 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_2e20 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_2e20 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_2e20 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_2e20 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_2e20 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_2e20[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(7 - local_2f84) * 4);
      *(int *)(in_RDX + (long)(0xf - local_2f84) * 4) =
           POPCOUNT((uint)(SUB321(local_2e40 >> 7,0) & 1) |
                    (uint)(SUB321(local_2e40 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_2e40 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_2e40 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_2e40 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_2e40 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_2e40 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_2e40 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_2e40 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_2e40 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_2e40 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_2e40 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_2e40 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_2e40 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_2e40 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_2e40 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_2e40 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_2e40 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_2e40 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_2e40 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_2e40 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_2e40 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_2e40 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_2e40 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_2e40 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_2e40 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_2e40 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_2e40 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_2e40 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_2e40 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_2e40 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_2e40[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(0xf - local_2f84) * 4);
      *(int *)(in_RDX + (long)(7 - local_2f84) * 4) =
           POPCOUNT((uint)(SUB321(local_2e60 >> 7,0) & 1) |
                    (uint)(SUB321(local_2e60 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_2e60 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_2e60 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_2e60 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_2e60 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_2e60 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_2e60 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_2e60 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_2e60 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_2e60 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_2e60 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_2e60 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_2e60 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_2e60 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_2e60 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_2e60 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_2e60 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_2e60 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_2e60 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_2e60 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_2e60 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_2e60 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_2e60 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_2e60 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_2e60 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_2e60 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_2e60 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_2e60 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_2e60 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_2e60 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_2e60[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(7 - local_2f84) * 4);
      *(int *)(in_RDX + (long)(0xf - local_2f84) * 4) =
           POPCOUNT((uint)(SUB321(local_2e80 >> 7,0) & 1) |
                    (uint)(SUB321(local_2e80 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_2e80 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_2e80 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_2e80 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_2e80 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_2e80 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_2e80 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_2e80 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_2e80 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_2e80 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_2e80 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_2e80 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_2e80 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_2e80 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_2e80 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_2e80 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_2e80 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_2e80 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_2e80 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_2e80 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_2e80 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_2e80 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_2e80 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_2e80 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_2e80 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_2e80 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_2e80 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_2e80 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_2e80 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_2e80 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_2e80[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(0xf - local_2f84) * 4);
      *(int *)(in_RDX + (long)(7 - local_2f84) * 4) =
           POPCOUNT((uint)(SUB321(local_2ea0 >> 7,0) & 1) |
                    (uint)(SUB321(local_2ea0 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_2ea0 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_2ea0 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_2ea0 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_2ea0 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_2ea0 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_2ea0 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_2ea0 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_2ea0 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_2ea0 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_2ea0 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_2ea0 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_2ea0 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_2ea0 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_2ea0 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_2ea0 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_2ea0 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_2ea0 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_2ea0 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_2ea0 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_2ea0 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_2ea0 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_2ea0 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_2ea0 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_2ea0 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_2ea0 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_2ea0 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_2ea0 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_2ea0 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_2ea0 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_2ea0[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(7 - local_2f84) * 4);
      *(int *)(in_RDX + (long)(0xf - local_2f84) * 4) =
           POPCOUNT((uint)(SUB321(local_2ec0 >> 7,0) & 1) |
                    (uint)(SUB321(local_2ec0 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_2ec0 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_2ec0 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_2ec0 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_2ec0 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_2ec0 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_2ec0 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_2ec0 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_2ec0 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_2ec0 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_2ec0 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_2ec0 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_2ec0 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_2ec0 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_2ec0 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_2ec0 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_2ec0 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_2ec0 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_2ec0 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_2ec0 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_2ec0 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_2ec0 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_2ec0 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_2ec0 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_2ec0 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_2ec0 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_2ec0 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_2ec0 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_2ec0 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_2ec0 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_2ec0[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(0xf - local_2f84) * 4);
      *(int *)(in_RDX + (long)(7 - local_2f84) * 4) =
           POPCOUNT((uint)(SUB321(local_2ee0 >> 7,0) & 1) |
                    (uint)(SUB321(local_2ee0 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_2ee0 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_2ee0 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_2ee0 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_2ee0 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_2ee0 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_2ee0 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_2ee0 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_2ee0 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_2ee0 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_2ee0 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_2ee0 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_2ee0 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_2ee0 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_2ee0 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_2ee0 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_2ee0 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_2ee0 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_2ee0 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_2ee0 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_2ee0 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_2ee0 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_2ee0 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_2ee0 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_2ee0 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_2ee0 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_2ee0 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_2ee0 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_2ee0 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_2ee0 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_2ee0[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(7 - local_2f84) * 4);
      *(int *)(in_RDX + (long)(0xf - local_2f84) * 4) =
           POPCOUNT((uint)(SUB321(local_2f00 >> 7,0) & 1) |
                    (uint)(SUB321(local_2f00 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_2f00 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_2f00 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_2f00 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_2f00 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_2f00 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_2f00 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_2f00 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_2f00 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_2f00 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_2f00 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_2f00 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_2f00 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_2f00 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_2f00 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_2f00 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_2f00 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_2f00 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_2f00 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_2f00 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_2f00 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_2f00 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_2f00 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_2f00 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_2f00 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_2f00 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_2f00 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_2f00 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_2f00 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_2f00 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_2f00[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(0xf - local_2f84) * 4);
      *(int *)(in_RDX + (long)(7 - local_2f84) * 4) =
           POPCOUNT((uint)(SUB321(local_2f20 >> 7,0) & 1) |
                    (uint)(SUB321(local_2f20 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_2f20 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_2f20 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_2f20 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_2f20 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_2f20 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_2f20 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_2f20 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_2f20 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_2f20 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_2f20 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_2f20 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_2f20 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_2f20 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_2f20 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_2f20 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_2f20 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_2f20 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_2f20 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_2f20 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_2f20 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_2f20 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_2f20 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_2f20 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_2f20 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_2f20 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_2f20 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_2f20 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_2f20 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_2f20 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_2f20[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(7 - local_2f84) * 4);
      *(int *)(in_RDX + (long)(0xf - local_2f84) * 4) =
           POPCOUNT((uint)(SUB321(local_2f40 >> 7,0) & 1) |
                    (uint)(SUB321(local_2f40 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_2f40 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_2f40 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_2f40 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_2f40 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_2f40 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_2f40 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_2f40 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_2f40 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_2f40 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_2f40 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_2f40 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_2f40 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_2f40 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_2f40 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_2f40 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_2f40 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_2f40 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_2f40 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_2f40 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_2f40 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_2f40 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_2f40 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_2f40 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_2f40 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_2f40 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_2f40 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_2f40 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_2f40 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_2f40 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_2f40[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(0xf - local_2f84) * 4);
      *(int *)(in_RDX + (long)(7 - local_2f84) * 4) =
           POPCOUNT((uint)(SUB321(local_2f60 >> 7,0) & 1) |
                    (uint)(SUB321(local_2f60 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_2f60 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_2f60 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_2f60 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_2f60 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_2f60 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_2f60 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_2f60 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_2f60 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_2f60 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_2f60 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_2f60 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_2f60 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_2f60 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_2f60 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_2f60 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_2f60 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_2f60 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_2f60 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_2f60 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_2f60 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_2f60 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_2f60 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_2f60 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_2f60 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_2f60 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_2f60 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_2f60 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_2f60 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_2f60 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_2f60[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(7 - local_2f84) * 4);
      *(int *)(in_RDX + (long)(0xf - local_2f84) * 4) =
           POPCOUNT((uint)(SUB321(local_2f80 >> 7,0) & 1) |
                    (uint)(SUB321(local_2f80 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_2f80 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_2f80 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_2f80 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_2f80 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_2f80 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_2f80 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_2f80 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_2f80 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_2f80 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_2f80 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_2f80 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_2f80 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_2f80 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_2f80 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_2f80 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_2f80 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_2f80 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_2f80 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_2f80 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_2f80 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_2f80 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_2f80 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_2f80 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_2f80 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_2f80 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_2f80 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_2f80 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_2f80 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_2f80 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_2f80[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(0xf - local_2f84) * 4);
      local_2da0 = vpaddb_avx2(local_2da0,local_2da0);
      local_2dc0 = vpaddb_avx2(local_2dc0,local_2dc0);
      local_2de0 = vpaddb_avx2(local_2de0,local_2de0);
      local_2e00 = vpaddb_avx2(local_2e00,local_2e00);
      local_2e20 = vpaddb_avx2(local_2e20,local_2e20);
      local_2e40 = vpaddb_avx2(local_2e40,local_2e40);
      local_2e60 = vpaddb_avx2(local_2e60,local_2e60);
      local_2e80 = vpaddb_avx2(local_2e80,local_2e80);
      local_2ea0 = vpaddb_avx2(local_2ea0,local_2ea0);
      local_2ec0 = vpaddb_avx2(local_2ec0,local_2ec0);
      local_2ee0 = vpaddb_avx2(local_2ee0,local_2ee0);
      local_2f00 = vpaddb_avx2(local_2f00,local_2f00);
      local_2f20 = vpaddb_avx2(local_2f20,local_2f20);
      local_2f40 = vpaddb_avx2(local_2f40,local_2f40);
      local_2f60 = vpaddb_avx2(local_2f60,local_2f60);
      local_2f80 = vpaddb_avx2(local_2f80,local_2f80);
    }
  }
  for (; local_2b70 + 8 <= (ulong)uVar45; local_2b70 = local_2b70 + 8) {
    pauVar47 = (undefined1 (*) [32])(in_RDI + local_2b70 * 0x20);
    pauVar1 = (undefined1 (*) [32])(in_RDI + 0x20 + local_2b70 * 0x20);
    pauVar49 = (undefined1 (*) [32])(in_RDI + 0x40 + local_2b70 * 0x20);
    pauVar2 = (undefined1 (*) [32])(in_RDI + 0x60 + local_2b70 * 0x20);
    pauVar48 = (undefined1 (*) [32])(in_RDI + 0x80 + local_2b70 * 0x20);
    pauVar3 = (undefined1 (*) [32])(in_RDI + 0xa0 + local_2b70 * 0x20);
    pauVar4 = (undefined1 (*) [32])(in_RDI + 0xc0 + local_2b70 * 0x20);
    pauVar5 = (undefined1 (*) [32])(in_RDI + 0xe0 + local_2b70 * 0x20);
    auVar13 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar13 = vpinsrw_avx(auVar13,0xff,2);
    auVar13 = vpinsrw_avx(auVar13,0xff,3);
    auVar13 = vpinsrw_avx(auVar13,0xff,4);
    auVar13 = vpinsrw_avx(auVar13,0xff,5);
    auVar13 = vpinsrw_avx(auVar13,0xff,6);
    auVar13 = vpinsrw_avx(auVar13,0xff,7);
    auVar14 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar14 = vpinsrw_avx(auVar14,0xff,2);
    auVar14 = vpinsrw_avx(auVar14,0xff,3);
    auVar14 = vpinsrw_avx(auVar14,0xff,4);
    auVar14 = vpinsrw_avx(auVar14,0xff,5);
    auVar14 = vpinsrw_avx(auVar14,0xff,6);
    auVar14 = vpinsrw_avx(auVar14,0xff,7);
    uStack_f70 = auVar14._0_8_;
    uStack_f68 = auVar14._8_8_;
    auVar30._16_8_ = uStack_f70;
    auVar30._0_16_ = auVar13;
    auVar30._24_8_ = uStack_f68;
    auVar15 = vpand_avx2(*pauVar47,auVar30);
    auVar16 = vpsllw_avx2(*pauVar1,ZEXT416(8));
    local_30c0 = vpor_avx2(auVar15,auVar16);
    auVar13 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar13 = vpinsrw_avx(auVar13,0xff00,2);
    auVar13 = vpinsrw_avx(auVar13,0xff00,3);
    auVar13 = vpinsrw_avx(auVar13,0xff00,4);
    auVar13 = vpinsrw_avx(auVar13,0xff00,5);
    auVar13 = vpinsrw_avx(auVar13,0xff00,6);
    auVar13 = vpinsrw_avx(auVar13,0xff00,7);
    auVar14 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar14 = vpinsrw_avx(auVar14,0xff00,2);
    auVar14 = vpinsrw_avx(auVar14,0xff00,3);
    auVar14 = vpinsrw_avx(auVar14,0xff00,4);
    auVar14 = vpinsrw_avx(auVar14,0xff00,5);
    auVar14 = vpinsrw_avx(auVar14,0xff00,6);
    auVar14 = vpinsrw_avx(auVar14,0xff00,7);
    uStack_f30 = auVar14._0_8_;
    uStack_f28 = auVar14._8_8_;
    auVar29._16_8_ = uStack_f30;
    auVar29._0_16_ = auVar13;
    auVar29._24_8_ = uStack_f28;
    auVar15 = vpand_avx2(*pauVar47,auVar29);
    auVar16 = vpsrlw_avx2(*pauVar1,ZEXT416(8));
    local_30e0 = vpor_avx2(auVar15,auVar16);
    auVar13 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar13 = vpinsrw_avx(auVar13,0xff,2);
    auVar13 = vpinsrw_avx(auVar13,0xff,3);
    auVar13 = vpinsrw_avx(auVar13,0xff,4);
    auVar13 = vpinsrw_avx(auVar13,0xff,5);
    auVar13 = vpinsrw_avx(auVar13,0xff,6);
    auVar13 = vpinsrw_avx(auVar13,0xff,7);
    auVar14 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar14 = vpinsrw_avx(auVar14,0xff,2);
    auVar14 = vpinsrw_avx(auVar14,0xff,3);
    auVar14 = vpinsrw_avx(auVar14,0xff,4);
    auVar14 = vpinsrw_avx(auVar14,0xff,5);
    auVar14 = vpinsrw_avx(auVar14,0xff,6);
    auVar14 = vpinsrw_avx(auVar14,0xff,7);
    uStack_ef0 = auVar14._0_8_;
    uStack_ee8 = auVar14._8_8_;
    auVar28._16_8_ = uStack_ef0;
    auVar28._0_16_ = auVar13;
    auVar28._24_8_ = uStack_ee8;
    auVar15 = vpand_avx2(*pauVar49,auVar28);
    auVar16 = vpsllw_avx2(*pauVar2,ZEXT416(8));
    local_3100 = vpor_avx2(auVar15,auVar16);
    auVar13 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar13 = vpinsrw_avx(auVar13,0xff00,2);
    auVar13 = vpinsrw_avx(auVar13,0xff00,3);
    auVar13 = vpinsrw_avx(auVar13,0xff00,4);
    auVar13 = vpinsrw_avx(auVar13,0xff00,5);
    auVar13 = vpinsrw_avx(auVar13,0xff00,6);
    auVar13 = vpinsrw_avx(auVar13,0xff00,7);
    auVar14 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar14 = vpinsrw_avx(auVar14,0xff00,2);
    auVar14 = vpinsrw_avx(auVar14,0xff00,3);
    auVar14 = vpinsrw_avx(auVar14,0xff00,4);
    auVar14 = vpinsrw_avx(auVar14,0xff00,5);
    auVar14 = vpinsrw_avx(auVar14,0xff00,6);
    auVar14 = vpinsrw_avx(auVar14,0xff00,7);
    uStack_eb0 = auVar14._0_8_;
    uStack_ea8 = auVar14._8_8_;
    auVar27._16_8_ = uStack_eb0;
    auVar27._0_16_ = auVar13;
    auVar27._24_8_ = uStack_ea8;
    auVar15 = vpand_avx2(*pauVar49,auVar27);
    auVar16 = vpsrlw_avx2(*pauVar2,ZEXT416(8));
    local_3120 = vpor_avx2(auVar15,auVar16);
    auVar13 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar13 = vpinsrw_avx(auVar13,0xff,2);
    auVar13 = vpinsrw_avx(auVar13,0xff,3);
    auVar13 = vpinsrw_avx(auVar13,0xff,4);
    auVar13 = vpinsrw_avx(auVar13,0xff,5);
    auVar13 = vpinsrw_avx(auVar13,0xff,6);
    auVar13 = vpinsrw_avx(auVar13,0xff,7);
    auVar14 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar14 = vpinsrw_avx(auVar14,0xff,2);
    auVar14 = vpinsrw_avx(auVar14,0xff,3);
    auVar14 = vpinsrw_avx(auVar14,0xff,4);
    auVar14 = vpinsrw_avx(auVar14,0xff,5);
    auVar14 = vpinsrw_avx(auVar14,0xff,6);
    auVar14 = vpinsrw_avx(auVar14,0xff,7);
    uStack_e70 = auVar14._0_8_;
    uStack_e68 = auVar14._8_8_;
    auVar26._16_8_ = uStack_e70;
    auVar26._0_16_ = auVar13;
    auVar26._24_8_ = uStack_e68;
    auVar15 = vpand_avx2(*pauVar48,auVar26);
    auVar16 = vpsllw_avx2(*pauVar3,ZEXT416(8));
    local_3140 = vpor_avx2(auVar15,auVar16);
    auVar13 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar13 = vpinsrw_avx(auVar13,0xff00,2);
    auVar13 = vpinsrw_avx(auVar13,0xff00,3);
    auVar13 = vpinsrw_avx(auVar13,0xff00,4);
    auVar13 = vpinsrw_avx(auVar13,0xff00,5);
    auVar13 = vpinsrw_avx(auVar13,0xff00,6);
    auVar13 = vpinsrw_avx(auVar13,0xff00,7);
    auVar14 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar14 = vpinsrw_avx(auVar14,0xff00,2);
    auVar14 = vpinsrw_avx(auVar14,0xff00,3);
    auVar14 = vpinsrw_avx(auVar14,0xff00,4);
    auVar14 = vpinsrw_avx(auVar14,0xff00,5);
    auVar14 = vpinsrw_avx(auVar14,0xff00,6);
    auVar14 = vpinsrw_avx(auVar14,0xff00,7);
    uStack_e30 = auVar14._0_8_;
    uStack_e28 = auVar14._8_8_;
    auVar25._16_8_ = uStack_e30;
    auVar25._0_16_ = auVar13;
    auVar25._24_8_ = uStack_e28;
    auVar15 = vpand_avx2(*pauVar48,auVar25);
    auVar16 = vpsrlw_avx2(*pauVar3,ZEXT416(8));
    local_3160 = vpor_avx2(auVar15,auVar16);
    auVar13 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar13 = vpinsrw_avx(auVar13,0xff,2);
    auVar13 = vpinsrw_avx(auVar13,0xff,3);
    auVar13 = vpinsrw_avx(auVar13,0xff,4);
    auVar13 = vpinsrw_avx(auVar13,0xff,5);
    auVar13 = vpinsrw_avx(auVar13,0xff,6);
    auVar13 = vpinsrw_avx(auVar13,0xff,7);
    auVar14 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar14 = vpinsrw_avx(auVar14,0xff,2);
    auVar14 = vpinsrw_avx(auVar14,0xff,3);
    auVar14 = vpinsrw_avx(auVar14,0xff,4);
    auVar14 = vpinsrw_avx(auVar14,0xff,5);
    auVar14 = vpinsrw_avx(auVar14,0xff,6);
    auVar14 = vpinsrw_avx(auVar14,0xff,7);
    uStack_df0 = auVar14._0_8_;
    uStack_de8 = auVar14._8_8_;
    auVar24._16_8_ = uStack_df0;
    auVar24._0_16_ = auVar13;
    auVar24._24_8_ = uStack_de8;
    auVar15 = vpand_avx2(*pauVar4,auVar24);
    auVar16 = vpsllw_avx2(*pauVar5,ZEXT416(8));
    local_3180 = vpor_avx2(auVar15,auVar16);
    auVar13 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar13 = vpinsrw_avx(auVar13,0xff00,2);
    auVar13 = vpinsrw_avx(auVar13,0xff00,3);
    auVar13 = vpinsrw_avx(auVar13,0xff00,4);
    auVar13 = vpinsrw_avx(auVar13,0xff00,5);
    auVar13 = vpinsrw_avx(auVar13,0xff00,6);
    auVar13 = vpinsrw_avx(auVar13,0xff00,7);
    auVar14 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar14 = vpinsrw_avx(auVar14,0xff00,2);
    auVar14 = vpinsrw_avx(auVar14,0xff00,3);
    auVar14 = vpinsrw_avx(auVar14,0xff00,4);
    auVar14 = vpinsrw_avx(auVar14,0xff00,5);
    auVar14 = vpinsrw_avx(auVar14,0xff00,6);
    auVar14 = vpinsrw_avx(auVar14,0xff00,7);
    auVar50 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar13;
    uStack_db0 = auVar50._0_8_;
    uStack_da8 = auVar50._8_8_;
    auVar23._16_8_ = uStack_db0;
    auVar23._0_16_ = ZEXT116(0) * auVar13 + ZEXT116(1) * auVar14;
    auVar23._24_8_ = uStack_da8;
    auVar15 = vpand_avx2(*pauVar4,auVar23);
    auVar16 = vpsrlw_avx2(*pauVar5,ZEXT416(8));
    local_31a0 = vpor_avx2(auVar15,auVar16);
    for (local_31a4 = 0; local_31a4 < 8; local_31a4 = local_31a4 + 1) {
      *(int *)(in_RDX + (long)(7 - local_31a4) * 4) =
           POPCOUNT((uint)(SUB321(local_30c0 >> 7,0) & 1) |
                    (uint)(SUB321(local_30c0 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_30c0 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_30c0 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_30c0 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_30c0 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_30c0 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_30c0 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_30c0 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_30c0 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_30c0 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_30c0 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_30c0 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_30c0 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_30c0 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_30c0 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_30c0 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_30c0 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_30c0 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_30c0 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_30c0 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_30c0 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_30c0 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_30c0 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_30c0 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_30c0 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_30c0 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_30c0 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_30c0 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_30c0 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_30c0 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_30c0[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(7 - local_31a4) * 4);
      *(int *)(in_RDX + (long)(0xf - local_31a4) * 4) =
           POPCOUNT((uint)(SUB321(local_30e0 >> 7,0) & 1) |
                    (uint)(SUB321(local_30e0 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_30e0 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_30e0 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_30e0 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_30e0 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_30e0 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_30e0 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_30e0 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_30e0 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_30e0 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_30e0 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_30e0 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_30e0 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_30e0 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_30e0 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_30e0 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_30e0 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_30e0 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_30e0 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_30e0 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_30e0 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_30e0 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_30e0 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_30e0 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_30e0 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_30e0 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_30e0 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_30e0 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_30e0 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_30e0 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_30e0[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(0xf - local_31a4) * 4);
      *(int *)(in_RDX + (long)(7 - local_31a4) * 4) =
           POPCOUNT((uint)(SUB321(local_3100 >> 7,0) & 1) |
                    (uint)(SUB321(local_3100 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_3100 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_3100 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_3100 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_3100 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_3100 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_3100 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_3100 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_3100 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_3100 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_3100 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_3100 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_3100 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_3100 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_3100 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_3100 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_3100 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_3100 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_3100 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_3100 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_3100 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_3100 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_3100 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_3100 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_3100 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_3100 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_3100 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_3100 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_3100 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_3100 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_3100[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(7 - local_31a4) * 4);
      *(int *)(in_RDX + (long)(0xf - local_31a4) * 4) =
           POPCOUNT((uint)(SUB321(local_3120 >> 7,0) & 1) |
                    (uint)(SUB321(local_3120 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_3120 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_3120 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_3120 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_3120 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_3120 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_3120 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_3120 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_3120 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_3120 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_3120 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_3120 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_3120 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_3120 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_3120 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_3120 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_3120 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_3120 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_3120 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_3120 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_3120 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_3120 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_3120 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_3120 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_3120 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_3120 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_3120 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_3120 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_3120 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_3120 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_3120[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(0xf - local_31a4) * 4);
      *(int *)(in_RDX + (long)(7 - local_31a4) * 4) =
           POPCOUNT((uint)(SUB321(local_3140 >> 7,0) & 1) |
                    (uint)(SUB321(local_3140 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_3140 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_3140 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_3140 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_3140 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_3140 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_3140 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_3140 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_3140 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_3140 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_3140 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_3140 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_3140 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_3140 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_3140 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_3140 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_3140 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_3140 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_3140 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_3140 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_3140 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_3140 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_3140 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_3140 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_3140 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_3140 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_3140 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_3140 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_3140 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_3140 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_3140[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(7 - local_31a4) * 4);
      *(int *)(in_RDX + (long)(0xf - local_31a4) * 4) =
           POPCOUNT((uint)(SUB321(local_3160 >> 7,0) & 1) |
                    (uint)(SUB321(local_3160 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_3160 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_3160 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_3160 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_3160 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_3160 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_3160 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_3160 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_3160 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_3160 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_3160 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_3160 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_3160 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_3160 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_3160 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_3160 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_3160 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_3160 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_3160 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_3160 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_3160 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_3160 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_3160 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_3160 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_3160 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_3160 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_3160 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_3160 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_3160 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_3160 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_3160[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(0xf - local_31a4) * 4);
      *(int *)(in_RDX + (long)(7 - local_31a4) * 4) =
           POPCOUNT((uint)(SUB321(local_3180 >> 7,0) & 1) |
                    (uint)(SUB321(local_3180 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_3180 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_3180 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_3180 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_3180 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_3180 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_3180 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_3180 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_3180 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_3180 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_3180 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_3180 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_3180 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_3180 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_3180 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_3180 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_3180 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_3180 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_3180 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_3180 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_3180 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_3180 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_3180 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_3180 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_3180 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_3180 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_3180 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_3180 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_3180 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_3180 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_3180[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(7 - local_31a4) * 4);
      *(int *)(in_RDX + (long)(0xf - local_31a4) * 4) =
           POPCOUNT((uint)(SUB321(local_31a0 >> 7,0) & 1) |
                    (uint)(SUB321(local_31a0 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_31a0 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_31a0 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_31a0 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_31a0 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_31a0 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_31a0 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_31a0 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_31a0 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_31a0 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_31a0 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_31a0 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_31a0 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_31a0 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_31a0 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_31a0 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_31a0 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_31a0 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_31a0 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_31a0 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_31a0 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_31a0 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_31a0 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_31a0 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_31a0 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_31a0 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_31a0 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_31a0 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_31a0 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_31a0 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_31a0[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(0xf - local_31a4) * 4);
      local_30c0 = vpaddb_avx2(local_30c0,local_30c0);
      local_30e0 = vpaddb_avx2(local_30e0,local_30e0);
      local_3100 = vpaddb_avx2(local_3100,local_3100);
      local_3120 = vpaddb_avx2(local_3120,local_3120);
      local_3140 = vpaddb_avx2(local_3140,local_3140);
      local_3160 = vpaddb_avx2(local_3160,local_3160);
      local_3180 = vpaddb_avx2(local_3180,local_3180);
      local_31a0 = vpaddb_avx2(local_31a0,local_31a0);
    }
  }
  for (; local_2b70 + 4 <= (ulong)uVar45; local_2b70 = local_2b70 + 4) {
    pauVar48 = (undefined1 (*) [32])(in_RDI + local_2b70 * 0x20);
    pauVar1 = (undefined1 (*) [32])(in_RDI + 0x20 + local_2b70 * 0x20);
    pauVar49 = (undefined1 (*) [32])(in_RDI + 0x40 + local_2b70 * 0x20);
    pauVar2 = (undefined1 (*) [32])(in_RDI + 0x60 + local_2b70 * 0x20);
    auVar13 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar13 = vpinsrw_avx(auVar13,0xff,2);
    auVar13 = vpinsrw_avx(auVar13,0xff,3);
    auVar13 = vpinsrw_avx(auVar13,0xff,4);
    auVar13 = vpinsrw_avx(auVar13,0xff,5);
    auVar13 = vpinsrw_avx(auVar13,0xff,6);
    auVar13 = vpinsrw_avx(auVar13,0xff,7);
    auVar14 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar14 = vpinsrw_avx(auVar14,0xff,2);
    auVar14 = vpinsrw_avx(auVar14,0xff,3);
    auVar14 = vpinsrw_avx(auVar14,0xff,4);
    auVar14 = vpinsrw_avx(auVar14,0xff,5);
    auVar14 = vpinsrw_avx(auVar14,0xff,6);
    auVar14 = vpinsrw_avx(auVar14,0xff,7);
    uStack_d70 = auVar14._0_8_;
    uStack_d68 = auVar14._8_8_;
    auVar22._16_8_ = uStack_d70;
    auVar22._0_16_ = auVar13;
    auVar22._24_8_ = uStack_d68;
    auVar15 = vpand_avx2(*pauVar48,auVar22);
    auVar16 = vpsllw_avx2(*pauVar1,ZEXT416(8));
    local_3260 = vpor_avx2(auVar15,auVar16);
    auVar13 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar13 = vpinsrw_avx(auVar13,0xff00,2);
    auVar13 = vpinsrw_avx(auVar13,0xff00,3);
    auVar13 = vpinsrw_avx(auVar13,0xff00,4);
    auVar13 = vpinsrw_avx(auVar13,0xff00,5);
    auVar13 = vpinsrw_avx(auVar13,0xff00,6);
    auVar13 = vpinsrw_avx(auVar13,0xff00,7);
    auVar14 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar14 = vpinsrw_avx(auVar14,0xff00,2);
    auVar14 = vpinsrw_avx(auVar14,0xff00,3);
    auVar14 = vpinsrw_avx(auVar14,0xff00,4);
    auVar14 = vpinsrw_avx(auVar14,0xff00,5);
    auVar14 = vpinsrw_avx(auVar14,0xff00,6);
    auVar14 = vpinsrw_avx(auVar14,0xff00,7);
    uStack_d30 = auVar14._0_8_;
    uStack_d28 = auVar14._8_8_;
    auVar21._16_8_ = uStack_d30;
    auVar21._0_16_ = auVar13;
    auVar21._24_8_ = uStack_d28;
    auVar15 = vpand_avx2(*pauVar48,auVar21);
    auVar16 = vpsrlw_avx2(*pauVar1,ZEXT416(8));
    local_3280 = vpor_avx2(auVar15,auVar16);
    auVar13 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar13 = vpinsrw_avx(auVar13,0xff,2);
    auVar13 = vpinsrw_avx(auVar13,0xff,3);
    auVar13 = vpinsrw_avx(auVar13,0xff,4);
    auVar13 = vpinsrw_avx(auVar13,0xff,5);
    auVar13 = vpinsrw_avx(auVar13,0xff,6);
    auVar13 = vpinsrw_avx(auVar13,0xff,7);
    auVar14 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar14 = vpinsrw_avx(auVar14,0xff,2);
    auVar14 = vpinsrw_avx(auVar14,0xff,3);
    auVar14 = vpinsrw_avx(auVar14,0xff,4);
    auVar14 = vpinsrw_avx(auVar14,0xff,5);
    auVar14 = vpinsrw_avx(auVar14,0xff,6);
    auVar14 = vpinsrw_avx(auVar14,0xff,7);
    uStack_cf0 = auVar14._0_8_;
    uStack_ce8 = auVar14._8_8_;
    auVar20._16_8_ = uStack_cf0;
    auVar20._0_16_ = auVar13;
    auVar20._24_8_ = uStack_ce8;
    auVar15 = vpand_avx2(*pauVar49,auVar20);
    auVar16 = vpsllw_avx2(*pauVar2,ZEXT416(8));
    local_32a0 = vpor_avx2(auVar15,auVar16);
    auVar13 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar13 = vpinsrw_avx(auVar13,0xff00,2);
    auVar13 = vpinsrw_avx(auVar13,0xff00,3);
    auVar13 = vpinsrw_avx(auVar13,0xff00,4);
    auVar13 = vpinsrw_avx(auVar13,0xff00,5);
    auVar13 = vpinsrw_avx(auVar13,0xff00,6);
    auVar13 = vpinsrw_avx(auVar13,0xff00,7);
    auVar14 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar14 = vpinsrw_avx(auVar14,0xff00,2);
    auVar14 = vpinsrw_avx(auVar14,0xff00,3);
    auVar14 = vpinsrw_avx(auVar14,0xff00,4);
    auVar14 = vpinsrw_avx(auVar14,0xff00,5);
    auVar14 = vpinsrw_avx(auVar14,0xff00,6);
    auVar14 = vpinsrw_avx(auVar14,0xff00,7);
    auVar50 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar13;
    uStack_cb0 = auVar50._0_8_;
    uStack_ca8 = auVar50._8_8_;
    auVar19._16_8_ = uStack_cb0;
    auVar19._0_16_ = ZEXT116(0) * auVar13 + ZEXT116(1) * auVar14;
    auVar19._24_8_ = uStack_ca8;
    auVar15 = vpand_avx2(*pauVar49,auVar19);
    auVar16 = vpsrlw_avx2(*pauVar2,ZEXT416(8));
    local_32c0 = vpor_avx2(auVar15,auVar16);
    for (local_32c4 = 0; local_32c4 < 8; local_32c4 = local_32c4 + 1) {
      *(int *)(in_RDX + (long)(7 - local_32c4) * 4) =
           POPCOUNT((uint)(SUB321(local_3260 >> 7,0) & 1) |
                    (uint)(SUB321(local_3260 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_3260 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_3260 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_3260 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_3260 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_3260 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_3260 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_3260 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_3260 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_3260 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_3260 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_3260 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_3260 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_3260 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_3260 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_3260 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_3260 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_3260 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_3260 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_3260 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_3260 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_3260 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_3260 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_3260 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_3260 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_3260 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_3260 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_3260 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_3260 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_3260 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_3260[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(7 - local_32c4) * 4);
      *(int *)(in_RDX + (long)(0xf - local_32c4) * 4) =
           POPCOUNT((uint)(SUB321(local_3280 >> 7,0) & 1) |
                    (uint)(SUB321(local_3280 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_3280 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_3280 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_3280 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_3280 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_3280 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_3280 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_3280 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_3280 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_3280 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_3280 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_3280 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_3280 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_3280 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_3280 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_3280 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_3280 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_3280 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_3280 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_3280 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_3280 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_3280 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_3280 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_3280 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_3280 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_3280 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_3280 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_3280 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_3280 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_3280 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_3280[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(0xf - local_32c4) * 4);
      *(int *)(in_RDX + (long)(7 - local_32c4) * 4) =
           POPCOUNT((uint)(SUB321(local_32a0 >> 7,0) & 1) |
                    (uint)(SUB321(local_32a0 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_32a0 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_32a0 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_32a0 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_32a0 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_32a0 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_32a0 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_32a0 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_32a0 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_32a0 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_32a0 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_32a0 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_32a0 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_32a0 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_32a0 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_32a0 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_32a0 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_32a0 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_32a0 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_32a0 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_32a0 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_32a0 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_32a0 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_32a0 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_32a0 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_32a0 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_32a0 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_32a0 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_32a0 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_32a0 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_32a0[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(7 - local_32c4) * 4);
      *(int *)(in_RDX + (long)(0xf - local_32c4) * 4) =
           POPCOUNT((uint)(SUB321(local_32c0 >> 7,0) & 1) |
                    (uint)(SUB321(local_32c0 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_32c0 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_32c0 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_32c0 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_32c0 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_32c0 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_32c0 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_32c0 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_32c0 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_32c0 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_32c0 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_32c0 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_32c0 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_32c0 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_32c0 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_32c0 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_32c0 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_32c0 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_32c0 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_32c0 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_32c0 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_32c0 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_32c0 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_32c0 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_32c0 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_32c0 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_32c0 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_32c0 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_32c0 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_32c0 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_32c0[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(0xf - local_32c4) * 4);
      local_3260 = vpaddb_avx2(local_3260,local_3260);
      local_3280 = vpaddb_avx2(local_3280,local_3280);
      local_32a0 = vpaddb_avx2(local_32a0,local_32a0);
      local_32c0 = vpaddb_avx2(local_32c0,local_32c0);
    }
  }
  for (; local_2b70 + 2 <= (ulong)uVar45; local_2b70 = local_2b70 + 2) {
    pauVar49 = (undefined1 (*) [32])(in_RDI + local_2b70 * 0x20);
    pauVar1 = (undefined1 (*) [32])(in_RDI + 0x20 + local_2b70 * 0x20);
    auVar13 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar13 = vpinsrw_avx(auVar13,0xff,2);
    auVar13 = vpinsrw_avx(auVar13,0xff,3);
    auVar13 = vpinsrw_avx(auVar13,0xff,4);
    auVar13 = vpinsrw_avx(auVar13,0xff,5);
    auVar13 = vpinsrw_avx(auVar13,0xff,6);
    auVar13 = vpinsrw_avx(auVar13,0xff,7);
    auVar14 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar14 = vpinsrw_avx(auVar14,0xff,2);
    auVar14 = vpinsrw_avx(auVar14,0xff,3);
    auVar14 = vpinsrw_avx(auVar14,0xff,4);
    auVar14 = vpinsrw_avx(auVar14,0xff,5);
    auVar14 = vpinsrw_avx(auVar14,0xff,6);
    auVar14 = vpinsrw_avx(auVar14,0xff,7);
    uStack_c70 = auVar14._0_8_;
    uStack_c68 = auVar14._8_8_;
    auVar18._16_8_ = uStack_c70;
    auVar18._0_16_ = auVar13;
    auVar18._24_8_ = uStack_c68;
    auVar15 = vpand_avx2(*pauVar49,auVar18);
    auVar16 = vpsllw_avx2(*pauVar1,ZEXT416(8));
    local_3340 = vpor_avx2(auVar15,auVar16);
    auVar13 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar13 = vpinsrw_avx(auVar13,0xff00,2);
    auVar13 = vpinsrw_avx(auVar13,0xff00,3);
    auVar13 = vpinsrw_avx(auVar13,0xff00,4);
    auVar13 = vpinsrw_avx(auVar13,0xff00,5);
    auVar13 = vpinsrw_avx(auVar13,0xff00,6);
    auVar13 = vpinsrw_avx(auVar13,0xff00,7);
    auVar14 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar14 = vpinsrw_avx(auVar14,0xff00,2);
    auVar14 = vpinsrw_avx(auVar14,0xff00,3);
    auVar14 = vpinsrw_avx(auVar14,0xff00,4);
    auVar14 = vpinsrw_avx(auVar14,0xff00,5);
    auVar14 = vpinsrw_avx(auVar14,0xff00,6);
    auVar14 = vpinsrw_avx(auVar14,0xff00,7);
    auVar50 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar13;
    uStack_c30 = auVar50._0_8_;
    uStack_c28 = auVar50._8_8_;
    auVar17._16_8_ = uStack_c30;
    auVar17._0_16_ = ZEXT116(0) * auVar13 + ZEXT116(1) * auVar14;
    auVar17._24_8_ = uStack_c28;
    auVar15 = vpand_avx2(*pauVar49,auVar17);
    auVar16 = vpsrlw_avx2(*pauVar1,ZEXT416(8));
    local_3360 = vpor_avx2(auVar15,auVar16);
    for (local_3364 = 0; local_3364 < 8; local_3364 = local_3364 + 1) {
      *(int *)(in_RDX + (long)(7 - local_3364) * 4) =
           POPCOUNT((uint)(SUB321(local_3340 >> 7,0) & 1) |
                    (uint)(SUB321(local_3340 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_3340 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_3340 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_3340 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_3340 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_3340 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_3340 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_3340 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_3340 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_3340 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_3340 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_3340 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_3340 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_3340 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_3340 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_3340 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_3340 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_3340 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_3340 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_3340 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_3340 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_3340 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_3340 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_3340 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_3340 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_3340 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_3340 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_3340 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_3340 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_3340 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_3340[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(7 - local_3364) * 4);
      *(int *)(in_RDX + (long)(0xf - local_3364) * 4) =
           POPCOUNT((uint)(SUB321(local_3360 >> 7,0) & 1) |
                    (uint)(SUB321(local_3360 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_3360 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_3360 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_3360 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_3360 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_3360 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_3360 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_3360 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_3360 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_3360 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_3360 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_3360 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_3360 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_3360 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_3360 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_3360 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_3360 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_3360 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_3360 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_3360 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_3360 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_3360 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_3360 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_3360 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_3360 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_3360 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_3360 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_3360 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_3360 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_3360 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_3360[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(0xf - local_3364) * 4);
      local_3340 = vpaddb_avx2(local_3340,local_3340);
      local_3360 = vpaddb_avx2(local_3360,local_3360);
    }
  }
  for (local_2b70 = local_2b70 << 4; local_2b70 < in_ESI; local_2b70 = local_2b70 + 1) {
    for (local_3368 = 0; local_3368 < 0x10; local_3368 = local_3368 + 1) {
      *(int *)(in_RDX + (long)local_3368 * 4) =
           ((int)((uint)*(ushort *)(in_RDI + local_2b70 * 2) & 1 << ((byte)local_3368 & 0x1f)) >>
           ((byte)local_3368 & 0x1f)) + *(int *)(in_RDX + (long)local_3368 * 4);
    }
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx2_blend_popcnt_unroll16(const uint16_t* array, uint32_t len, uint32_t* flags) {
    const __m256i* data_vectors = (const __m256i*)(array);
    const uint32_t n_cycles = len / 16;

    size_t i = 0;
    for (/**/; i + 16 <= n_cycles; i += 16) {
#define L(p) __m256i v##p = _mm256_loadu_si256(data_vectors+i+p);
        L(0)  L(1)  L(2)  L(3)  
        L(4)  L(5)  L(6)  L(7) 
        L(8)  L(9)  L(10) L(11) 
        L(12) L(13) L(14) L(15)

#define U0(p,k) __m256i input##p = _mm256_or_si256(_mm256_and_si256(v##p, _mm256_set1_epi16(0x00FF)), _mm256_slli_epi16(v##k, 8));
#define U1(p,k) __m256i input##k = _mm256_or_si256(_mm256_and_si256(v##p, _mm256_set1_epi16((int16_t)0xFF00)), _mm256_srli_epi16(v##k, 8));
#define U(p, k)  U0(p,k) U1(p,k)
    U(0,1) U( 2, 3) U( 4, 5) U( 6, 7)
    U(8,9) U(10,11) U(12,13) U(14,15)

        for (int i = 0; i < 8; ++i) {
#define A0(p) flags[ 7 - i] += _mm_popcnt_u32(_mm256_movemask_epi8(input##p));
#define A1(k) flags[15 - i] += _mm_popcnt_u32(_mm256_movemask_epi8(input##k));
#define A(p, k) A0(p) A1(k)
            A(0,1) A( 2, 3) A( 4, 5) A( 6, 7)
            A(8,9) A(10,11) A(12,13) A(14,15)

#define P0(p) input##p = _mm256_add_epi8(input##p, input##p);
#define P(p, k) P0(p) P0(k)
            P(0,1) P( 2, 3) P( 4, 5) P( 6, 7)
            P(8,9) P(10,11) P(12,13) P(14,15)
        }
    }

    for (/**/; i + 8 <= n_cycles; i += 8) {
        L(0) L(1) L(2) L(3)
        L(4) L(5) L(6) L(7) 
        U(0,1) U(2, 3) U(4, 5) U(6, 7)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1) A( 2, 3) A( 4, 5) A( 6, 7)
            P(0,1) P( 2, 3) P( 4, 5) P( 6, 7)
        }
    }

    for (/**/; i + 4 <= n_cycles; i += 4) {
        L(0) L(1) L(2) L(3)
        U(0,1) U(2, 3)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1) A( 2, 3)
            P(0,1) P( 2, 3)
        }
    }

    for (/**/; i + 2 <= n_cycles; i += 2) {
        L(0) L(1)
        U(0,1)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1)
            P(0,1)
        }
    }

#undef L
#undef U0
#undef U1
#undef U
#undef A0
#undef A1
#undef A
#undef P0
#undef P

    i *= 16;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }
    
    return 0;
}